

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractanimation.cpp
# Opt level: O0

void QAbstractAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  Direction *pDVar2;
  undefined8 *puVar3;
  bool bVar4;
  Direction DVar5;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QAbstractAnimation *in_RDI;
  long in_FS_OFFSET;
  QBindable<QAbstractAnimation::State> QVar6;
  QBindable<int> QVar7;
  QBindable<QAbstractAnimation::Direction> QVar8;
  void *_v_1;
  void *_v;
  QAbstractAnimation *_t;
  QAbstractAnimation *in_stack_ffffffffffffff18;
  int loopCount;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  QAbstractAnimation *in_stack_ffffffffffffff28;
  code *in_stack_ffffffffffffff58;
  QAbstractAnimation *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff78;
  int msecs;
  QUntypedPropertyData *local_58;
  QBindableInterface *local_50;
  QUntypedPropertyData *local_48;
  QBindableInterface *local_40;
  QUntypedPropertyData *local_38;
  QBindableInterface *local_30;
  QUntypedPropertyData *local_28;
  QBindableInterface *local_20;
  QUntypedPropertyData *local_18;
  QBindableInterface *local_10;
  
  msecs = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    DVar5 = (Direction)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    switch(in_EDX) {
    case 0:
      finished((QAbstractAnimation *)0x66c018);
      break;
    case 1:
      stateChanged((QAbstractAnimation *)0x66c03d,DVar5,(State)in_stack_ffffffffffffff18);
      break;
    case 2:
      currentLoopChanged((QAbstractAnimation *)0x66c057,DVar5);
      break;
    case 3:
      directionChanged((QAbstractAnimation *)0x66c071,DVar5);
      break;
    case 4:
      start((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            DVar5);
      break;
    case 5:
      start((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            DVar5);
      break;
    case 6:
      pause(in_RDI);
      break;
    case 7:
      resume(in_stack_ffffffffffffff18);
      break;
    case 8:
      setPaused((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0));
      break;
    case 9:
      stop((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      break;
    case 10:
      setCurrentTime((QAbstractAnimation *)in_stack_ffffffffffffff58,msecs);
    }
  }
  loopCount = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if (in_ESI == 5) {
    msecs = 0;
    bVar4 = QtMocHelpers::indexOfMethod<void(QAbstractAnimation::*)()>(in_RCX,(void **)finished,0,0)
    ;
    if ((bVar4) ||
       (bVar4 = QtMocHelpers::
                indexOfMethod<void(QAbstractAnimation::*)(QAbstractAnimation::State,QAbstractAnimation::State)>
                          (in_RCX,(void **)stateChanged,0,1), bVar4)) goto switchD_0066c35f_default;
    in_stack_ffffffffffffff58 = currentLoopChanged;
    in_stack_ffffffffffffff60 = (QAbstractAnimation *)0x0;
    bVar4 = QtMocHelpers::indexOfMethod<void(QAbstractAnimation::*)(int)>
                      (in_RCX,(void **)currentLoopChanged,0,2);
    if ((bVar4) ||
       (bVar4 = QtMocHelpers::
                indexOfMethod<void(QAbstractAnimation::*)(QAbstractAnimation::Direction)>
                          (in_RCX,(void **)directionChanged,0,3), bVar4))
    goto switchD_0066c35f_default;
  }
  if (in_ESI == 1) {
    pDVar2 = *(Direction **)in_RCX;
    in_stack_ffffffffffffff28 = (QAbstractAnimation *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff28) {
    case (QAbstractAnimation *)0x0:
      DVar5 = state((QAbstractAnimation *)
                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      *pDVar2 = DVar5;
      break;
    case (QAbstractAnimation *)0x1:
      DVar5 = QAbstractAnimation::loopCount
                        ((QAbstractAnimation *)
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      *pDVar2 = DVar5;
      break;
    case (QAbstractAnimation *)0x2:
      DVar5 = currentTime((QAbstractAnimation *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      *pDVar2 = DVar5;
      break;
    case (QAbstractAnimation *)0x3:
      DVar5 = currentLoop((QAbstractAnimation *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      *pDVar2 = DVar5;
      break;
    case (QAbstractAnimation *)0x4:
      DVar5 = direction((QAbstractAnimation *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      *pDVar2 = DVar5;
      break;
    case (QAbstractAnimation *)0x5:
      DVar5 = (**(code **)(*(long *)in_RDI + 0x60))();
      *pDVar2 = DVar5;
    }
  }
  if (in_ESI == 2) {
    if (in_EDX == 1) {
      setLoopCount((QAbstractAnimation *)CONCAT44(1,in_stack_ffffffffffffff20),loopCount);
    }
    else if (in_EDX == 2) {
      setCurrentTime((QAbstractAnimation *)in_stack_ffffffffffffff58,msecs);
    }
    else if (in_EDX == 4) {
      setDirection(in_stack_ffffffffffffff60,(Direction)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    }
  }
  if (in_ESI == 8) {
    switch(in_EDX) {
    case 0:
      QVar6 = bindableState(in_stack_ffffffffffffff28);
      puVar3 = *(undefined8 **)in_RCX;
      local_18 = QVar6.super_QUntypedBindable.data;
      *puVar3 = local_18;
      local_10 = QVar6.super_QUntypedBindable.iface;
      puVar3[1] = local_10;
      break;
    case 1:
      QVar7 = bindableLoopCount(in_stack_ffffffffffffff28);
      puVar3 = *(undefined8 **)in_RCX;
      local_28 = QVar7.super_QUntypedBindable.data;
      *puVar3 = local_28;
      local_20 = QVar7.super_QUntypedBindable.iface;
      puVar3[1] = local_20;
      break;
    case 2:
      QVar7 = bindableCurrentTime(in_stack_ffffffffffffff28);
      puVar3 = *(undefined8 **)in_RCX;
      local_38 = QVar7.super_QUntypedBindable.data;
      *puVar3 = local_38;
      local_30 = QVar7.super_QUntypedBindable.iface;
      puVar3[1] = local_30;
      break;
    case 3:
      QVar7 = bindableCurrentLoop(in_stack_ffffffffffffff28);
      puVar3 = *(undefined8 **)in_RCX;
      local_48 = QVar7.super_QUntypedBindable.data;
      *puVar3 = local_48;
      local_40 = QVar7.super_QUntypedBindable.iface;
      puVar3[1] = local_40;
      break;
    case 4:
      QVar8 = bindableDirection(in_stack_ffffffffffffff28);
      puVar3 = *(undefined8 **)in_RCX;
      local_58 = QVar8.super_QUntypedBindable.data;
      *puVar3 = local_58;
      local_50 = QVar8.super_QUntypedBindable.iface;
      puVar3[1] = local_50;
    }
  }
switchD_0066c35f_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractAnimation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished(); break;
        case 1: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::State>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::State>>(_a[2]))); break;
        case 2: _t->currentLoopChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->directionChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::Direction>>(_a[1]))); break;
        case 4: _t->start((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::DeletionPolicy>>(_a[1]))); break;
        case 5: _t->start(); break;
        case 6: _t->pause(); break;
        case 7: _t->resume(); break;
        case 8: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 9: _t->stop(); break;
        case 10: _t->setCurrentTime((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)()>(_a, &QAbstractAnimation::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(QAbstractAnimation::State , QAbstractAnimation::State )>(_a, &QAbstractAnimation::stateChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(int )>(_a, &QAbstractAnimation::currentLoopChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(QAbstractAnimation::Direction )>(_a, &QAbstractAnimation::directionChanged, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<State*>(_v) = _t->state(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->loopCount(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentTime(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->currentLoop(); break;
        case 4: *reinterpret_cast<Direction*>(_v) = _t->direction(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setLoopCount(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setCurrentTime(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setDirection(*reinterpret_cast<Direction*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableState(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableLoopCount(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentTime(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentLoop(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDirection(); break;
        default: break;
        }
    }
}